

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D3MFOpcPackage.cpp
# Opt level: O0

void __thiscall
Assimp::D3MF::OpcPackageRelationshipReader::OpcPackageRelationshipReader
          (OpcPackageRelationshipReader *this,XmlReader *xmlReader)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  XmlReader *xmlReader_local;
  OpcPackageRelationshipReader *this_local;
  
  std::
  vector<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>,_std::allocator<std::shared_ptr<Assimp::D3MF::OpcPackageRelationship>_>_>
  ::vector(&this->m_relationShips);
  while (uVar2 = (*xmlReader->_vptr_IIrrXMLReader[2])(), (uVar2 & 1) != 0) {
    iVar3 = (*xmlReader->_vptr_IIrrXMLReader[3])();
    if (iVar3 == 1) {
      iVar3 = (*xmlReader->_vptr_IIrrXMLReader[0xd])();
      bVar1 = std::operator==((char *)CONCAT44(extraout_var,iVar3),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              XmlTag::RELS_RELATIONSHIP_CONTAINER_abi_cxx11_);
      if (bVar1) {
        ParseRootNode(this,xmlReader);
      }
    }
  }
  return;
}

Assistant:

OpcPackageRelationshipReader(XmlReader* xmlReader) {        
        while(xmlReader->read()) {
            if(xmlReader->getNodeType() == irr::io::EXN_ELEMENT &&
               xmlReader->getNodeName() == XmlTag::RELS_RELATIONSHIP_CONTAINER)
            {
                ParseRootNode(xmlReader);
            }
        }
    }